

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O3

void __thiscall cmGlobalNinjaGenerator::Generate(cmGlobalNinjaGenerator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmake *this_00;
  cmGeneratedFileStream *pcVar2;
  bool bVar3;
  int iVar4;
  PolicyStatus PVar5;
  ostream *poVar6;
  _Rb_tree_node_base *p_Var7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *config;
  undefined1 auVar8 [8];
  ostringstream msg;
  string local_1d8;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_1b8;
  undefined1 local_1a0 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190 [6];
  ios_base local_130 [264];
  
  local_190[0]._M_allocated_capacity._0_4_ = 0x332e31;
  local_198 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x3;
  local_1a0 = (undefined1  [8])local_190;
  bVar3 = cmSystemTools::VersionCompare(OP_LESS,&this->NinjaVersion,(string *)local_1a0);
  if (local_1a0 != (undefined1  [8])local_190) {
    operator_delete((void *)local_1a0,
                    CONCAT44(local_190[0]._M_allocated_capacity._4_4_,
                             (undefined4)local_190[0]._M_allocated_capacity) + 1);
  }
  if (bVar3) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,"The detected version of Ninja (",0x1f);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,(this->NinjaVersion)._M_dataplus._M_p,
               (this->NinjaVersion)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,") is less than the version of Ninja required by CMake (",0x37);
    paVar1 = &local_1d8.field_2;
    local_1d8.field_2._M_allocated_capacity._0_4_ = 0x332e31;
    local_1d8._M_string_length = 3;
    local_1d8._M_dataplus._M_p = (pointer)paVar1;
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a0,paVar1->_M_local_buf,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,").",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1d8._M_dataplus._M_p,
                      CONCAT44(local_1d8.field_2._M_allocated_capacity._4_4_,
                               local_1d8.field_2._M_allocated_capacity._0_4_) + 1);
    }
    this_00 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance;
    std::__cxx11::stringbuf::str();
    local_1b8.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    local_1b8.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack(&local_1b8);
    cmake::IssueMessage(this_00,FATAL_ERROR,&local_1d8,(cmListFileBacktrace *)&local_1b8);
    if (local_1b8.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1b8.TopEntry.
                 super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1d8._M_dataplus._M_p,
                      CONCAT44(local_1d8.field_2._M_allocated_capacity._4_4_,
                               local_1d8.field_2._M_allocated_capacity._0_4_) + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
    std::ios_base::~ios_base(local_130);
  }
  else {
    InitOutputPathPrefix(this);
    iVar4 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
              [0x4e])(this);
    if (((char)iVar4 != '\0') && (bVar3 = OpenRulesFileStream(this), bVar3)) {
      for (p_Var7 = (this->Configs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var7 != &(this->Configs)._M_t._M_impl.super__Rb_tree_header;
          p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
        std::
        _Rb_tree<cmGlobalNinjaGenerator::ByConfig::TargetDependsClosureKey,_std::pair<const_cmGlobalNinjaGenerator::ByConfig::TargetDependsClosureKey,_std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_cmGlobalNinjaGenerator::ByConfig::TargetDependsClosureKey,_std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<cmGlobalNinjaGenerator::ByConfig::TargetDependsClosureKey>,_std::allocator<std::pair<const_cmGlobalNinjaGenerator::ByConfig::TargetDependsClosureKey,_std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        ::clear((_Rb_tree<cmGlobalNinjaGenerator::ByConfig::TargetDependsClosureKey,_std::pair<const_cmGlobalNinjaGenerator::ByConfig::TargetDependsClosureKey,_std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_cmGlobalNinjaGenerator::ByConfig::TargetDependsClosureKey,_std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<cmGlobalNinjaGenerator::ByConfig::TargetDependsClosureKey>,_std::allocator<std::pair<const_cmGlobalNinjaGenerator::ByConfig::TargetDependsClosureKey,_std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 *)(p_Var7 + 5));
      }
      paVar1 = &local_1d8.field_2;
      local_1d8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"all","");
      NinjaOutputPath((string *)local_1a0,this,&local_1d8);
      std::__cxx11::string::operator=((string *)&this->TargetAll,(string *)local_1a0);
      if (local_1a0 != (undefined1  [8])local_190) {
        operator_delete((void *)local_1a0,
                        CONCAT44(local_190[0]._M_allocated_capacity._4_4_,
                                 (undefined4)local_190[0]._M_allocated_capacity) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != paVar1) {
        operator_delete(local_1d8._M_dataplus._M_p,
                        CONCAT44(local_1d8.field_2._M_allocated_capacity._4_4_,
                                 local_1d8.field_2._M_allocated_capacity._0_4_) + 1);
      }
      local_1d8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"CMakeCache.txt","");
      NinjaOutputPath((string *)local_1a0,this,&local_1d8);
      std::__cxx11::string::operator=((string *)&this->CMakeCacheFile,(string *)local_1a0);
      if (local_1a0 != (undefined1  [8])local_190) {
        operator_delete((void *)local_1a0,
                        CONCAT44(local_190[0]._M_allocated_capacity._4_4_,
                                 (undefined4)local_190[0]._M_allocated_capacity) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != paVar1) {
        operator_delete(local_1d8._M_dataplus._M_p,
                        CONCAT44(local_1d8.field_2._M_allocated_capacity._4_4_,
                                 local_1d8.field_2._M_allocated_capacity._0_4_) + 1);
      }
      this->DiagnosedCxxModuleNinjaSupport = false;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&(this->super_cmGlobalCommonGenerator).ClangTidyExportFixesDirs._M_t);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&(this->super_cmGlobalCommonGenerator).ClangTidyExportFixesFiles._M_t);
      PVar5 = cmMakefile::GetPolicyStatus
                        (*(cmMakefile **)
                          ((long)(((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                                   LocalGenerators.
                                   super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                 super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>
                                 ._M_t + 0x70),CMP0058,false);
      this->PolicyCMP0058 = PVar5;
      this->ComputingUnknownDependencies = PVar5 < NEW;
      cmGlobalGenerator::Generate((cmGlobalGenerator *)this);
      WriteAssumedSourceDependencies(this);
      iVar4 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                _vptr_cmGlobalGenerator[0x48])(this);
      WriteTargetAliases(this,(ostream *)CONCAT44(extraout_var,iVar4));
      iVar4 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                _vptr_cmGlobalGenerator[0x48])(this);
      WriteFolderTargets(this,(ostream *)CONCAT44(extraout_var_00,iVar4));
      iVar4 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                _vptr_cmGlobalGenerator[0x48])(this);
      WriteUnknownExplicitDependencies(this,(ostream *)CONCAT44(extraout_var_01,iVar4));
      iVar4 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                _vptr_cmGlobalGenerator[0x48])(this);
      WriteBuiltinTargets(this,(ostream *)CONCAT44(extraout_var_02,iVar4));
      if (((cmSystemTools::s_ErrorOccurred != false) ||
          (cmSystemTools::s_FatalErrorOccurred != false)) ||
         (bVar3 = cmSystemTools::GetInterruptFlag(), bVar3)) {
        pcVar2 = (this->RulesFileStream)._M_t.
                 super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                 .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
        std::ios::clear((int)pcVar2 +
                        (int)*(undefined8 *)
                              (*(long *)&(pcVar2->super_ofstream).
                                         super_basic_ostream<char,_std::char_traits<char>_> + -0x18)
                       );
        cmMakefile::GetGeneratorConfigs_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_1a0,
                   (cmMakefile *)
                   (((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.Makefiles.
                     super__Vector_base<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                   super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t,
                   IncludeEmptyConfig);
        paVar1 = local_198;
        for (auVar8 = local_1a0; auVar8 != (undefined1  [8])paVar1;
            auVar8 = (undefined1  [8])((long)auVar8 + 0x20)) {
          iVar4 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                    _vptr_cmGlobalGenerator[0x45])(this,auVar8);
          std::ios::clear(iVar4 + (int)*(undefined8 *)
                                        (*(long *)CONCAT44(extraout_var_03,iVar4) + -0x18));
          iVar4 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                    _vptr_cmGlobalGenerator[0x46])(this,auVar8);
          std::ios::clear(iVar4 + (int)*(undefined8 *)
                                        (*(long *)CONCAT44(extraout_var_04,iVar4) + -0x18));
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_1a0);
        iVar4 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                  _vptr_cmGlobalGenerator[0x48])(this);
        std::ios::clear(iVar4 + (int)*(undefined8 *)
                                      (*(long *)CONCAT44(extraout_var_05,iVar4) + -0x18));
      }
      CloseCompileCommandsStream(this);
      CloseRulesFileStream(this);
      (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[0x4f])
                (this);
      CleanMetaData(this);
      cmGlobalCommonGenerator::RemoveUnknownClangTidyExportFixesFiles
                (&this->super_cmGlobalCommonGenerator);
    }
  }
  return;
}

Assistant:

void cmGlobalNinjaGenerator::Generate()
{
  // Check minimum Ninja version.
  if (cmSystemTools::VersionCompare(cmSystemTools::OP_LESS, this->NinjaVersion,
                                    RequiredNinjaVersion())) {
    std::ostringstream msg;
    msg << "The detected version of Ninja (" << this->NinjaVersion;
    msg << ") is less than the version of Ninja required by CMake (";
    msg << cmGlobalNinjaGenerator::RequiredNinjaVersion() << ").";
    this->GetCMakeInstance()->IssueMessage(MessageType::FATAL_ERROR,
                                           msg.str());
    return;
  }
  this->InitOutputPathPrefix();
  if (!this->OpenBuildFileStreams()) {
    return;
  }
  if (!this->OpenRulesFileStream()) {
    return;
  }

  for (auto& it : this->Configs) {
    it.second.TargetDependsClosures.clear();
  }

  this->TargetAll = this->NinjaOutputPath("all");
  this->CMakeCacheFile = this->NinjaOutputPath("CMakeCache.txt");
  this->DiagnosedCxxModuleNinjaSupport = false;
  this->ClangTidyExportFixesDirs.clear();
  this->ClangTidyExportFixesFiles.clear();

  this->PolicyCMP0058 =
    this->LocalGenerators[0]->GetMakefile()->GetPolicyStatus(
      cmPolicies::CMP0058);
  this->ComputingUnknownDependencies =
    (this->PolicyCMP0058 == cmPolicies::OLD ||
     this->PolicyCMP0058 == cmPolicies::WARN);

  this->cmGlobalGenerator::Generate();

  this->WriteAssumedSourceDependencies();
  this->WriteTargetAliases(*this->GetCommonFileStream());
  this->WriteFolderTargets(*this->GetCommonFileStream());
  this->WriteUnknownExplicitDependencies(*this->GetCommonFileStream());
  this->WriteBuiltinTargets(*this->GetCommonFileStream());

  if (cmSystemTools::GetErrorOccurredFlag()) {
    this->RulesFileStream->setstate(std::ios::failbit);
    for (auto const& config : this->Makefiles[0]->GetGeneratorConfigs(
           cmMakefile::IncludeEmptyConfig)) {
      this->GetImplFileStream(config)->setstate(std::ios::failbit);
      this->GetConfigFileStream(config)->setstate(std::ios::failbit);
    }
    this->GetCommonFileStream()->setstate(std::ios::failbit);
  }

  this->CloseCompileCommandsStream();
  this->CloseRulesFileStream();
  this->CloseBuildFileStreams();

#ifdef _WIN32
  // Older ninja tools will not be able to update metadata on Windows
  // when we are re-generating inside an existing 'ninja' invocation
  // because the outer tool has the files open for write.
  if (this->NinjaSupportsMetadataOnRegeneration ||
      !this->GetCMakeInstance()->GetRegenerateDuringBuild())
#endif
  {
    this->CleanMetaData();
  }

  this->RemoveUnknownClangTidyExportFixesFiles();
}